

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

string * __thiscall
cmCTestMultiProcessHandler::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestMultiProcessHandler *this,int test)

{
  mapped_type pcVar1;
  pointer pcVar2;
  mapped_type *ppcVar3;
  int local_c;
  
  local_c = test;
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_c);
  pcVar1 = *ppcVar3;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pcVar1->Name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestMultiProcessHandler::GetName(int test)
{
  return this->Properties[test]->Name;
}